

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

int __thiscall
Fl_PostScript_Graphics_Driver::draw_scaled
          (Fl_PostScript_Graphics_Driver *this,Fl_Image *img,int XP,int YP,int WP,int HP)

{
  int H;
  uint local_40;
  int W;
  int Y;
  int X;
  
  local_40 = YP;
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2b])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)(uint)WP,(ulong)(uint)HP,&X,&Y,&W,&H);
  if ((W != 0) && (H != 0)) {
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2d])(this);
    clocale_printf(this,"%d %d %i %i CL\n",(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,
                   (ulong)(uint)H);
    clocale_printf(this,"GS %d %d TR  %f %f SC GS\n",(double)((float)WP / (float)img->w_),
                   (double)((float)HP / (float)img->h_),(ulong)(uint)XP,(ulong)local_40);
    (*img->_vptr_Fl_Image[7])(img,0,0,(ulong)(uint)img->w_,(ulong)(uint)img->h_,0,0);
    clocale_printf(this,"GR GR\n");
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])(this);
  }
  return 1;
}

Assistant:

int Fl_PostScript_Graphics_Driver::draw_scaled(Fl_Image *img, int XP, int YP, int WP, int HP){
  int X, Y, W, H;
  clip_box(XP,YP,WP,HP,X,Y,W,H); // X,Y,W,H will give the unclipped area of XP,YP,WP,HP
  if (W == 0 || H == 0) return 1;
  push_no_clip(); // remove the FLTK clip that can't be rescaled
  clocale_printf("%d %d %i %i CL\n", X, Y, W, H);
  clocale_printf("GS %d %d TR  %f %f SC GS\n", XP, YP, float(WP)/img->w(), float(HP)/img->h());
  img->draw(0, 0, img->w(), img->h(), 0, 0);
  clocale_printf("GR GR\n");
  pop_clip(); // restore FLTK's clip
  return 1;
}